

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

string * __thiscall
Hospital::Getter_Password_abi_cxx11_(string *__return_storage_ptr__,Hospital *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Admin_Password);
  return __return_storage_ptr__;
}

Assistant:

string Hospital ::Getter_Password(){
    return Admin_Password;
}